

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O0

RESOURCE_STATE Diligent::VkImageLayoutToResourceState(VkImageLayout Layout)

{
  Char *pCVar1;
  char (*in_R8) [2];
  undefined1 local_c0 [8];
  string msg_4;
  string msg_3;
  string msg_2;
  string msg_1;
  undefined1 local_30 [8];
  string msg;
  VkImageLayout Layout_local;
  
  if (Layout == VK_IMAGE_LAYOUT_UNDEFINED) {
    msg.field_2._12_4_ = 1;
  }
  else if (Layout == VK_IMAGE_LAYOUT_GENERAL) {
    msg.field_2._12_4_ = 0x20;
  }
  else if (Layout == VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL) {
    msg.field_2._12_4_ = 0x10;
  }
  else if (Layout == VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL) {
    msg.field_2._12_4_ = 0x40;
  }
  else if (Layout == VK_IMAGE_LAYOUT_DEPTH_STENCIL_READ_ONLY_OPTIMAL) {
    msg.field_2._12_4_ = 0x80;
  }
  else if (Layout == VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL) {
    msg.field_2._12_4_ = 0x100;
  }
  else if (Layout == VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL) {
    msg.field_2._12_4_ = 0x1000;
  }
  else if (Layout == VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL) {
    msg.field_2._12_4_ = 0x800;
  }
  else {
    msg.field_2._8_4_ = Layout;
    if (Layout == VK_IMAGE_LAYOUT_PREINITIALIZED) {
      FormatString<char[29]>((string *)local_30,(char (*) [29])"This layout is not supported");
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"VkImageLayoutToResourceState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                 ,0x5d6);
      std::__cxx11::string::~string((string *)local_30);
      msg.field_2._12_4_ = 1;
    }
    else if (Layout == VK_IMAGE_LAYOUT_PRESENT_SRC_KHR) {
      msg.field_2._12_4_ = 0x10000;
    }
    else if (Layout == VK_IMAGE_LAYOUT_SHARED_PRESENT_KHR) {
      FormatString<char[29]>
                ((string *)((long)&msg_4.field_2 + 8),(char (*) [29])"This layout is not supported")
      ;
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"VkImageLayoutToResourceState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                 ,0x5da);
      std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
      msg.field_2._12_4_ = 1;
    }
    else if (Layout == VK_IMAGE_LAYOUT_DEPTH_READ_ONLY_STENCIL_ATTACHMENT_OPTIMAL) {
      FormatString<char[29]>
                ((string *)((long)&msg_2.field_2 + 8),(char (*) [29])"This layout is not supported")
      ;
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"VkImageLayoutToResourceState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                 ,0x5d7);
      std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
      msg.field_2._12_4_ = 1;
    }
    else if (Layout == VK_IMAGE_LAYOUT_DEPTH_ATTACHMENT_STENCIL_READ_ONLY_OPTIMAL) {
      FormatString<char[29]>
                ((string *)((long)&msg_3.field_2 + 8),(char (*) [29])"This layout is not supported")
      ;
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"VkImageLayoutToResourceState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                 ,0x5d8);
      std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
      msg.field_2._12_4_ = 1;
    }
    else if ((Layout == VK_IMAGE_LAYOUT_FRAGMENT_SHADING_RATE_ATTACHMENT_OPTIMAL_KHR) ||
            (Layout == VK_IMAGE_LAYOUT_FRAGMENT_DENSITY_MAP_OPTIMAL_EXT)) {
      msg.field_2._12_4_ = 0x200000;
    }
    else {
      FormatString<char[23],VkImageLayout,char[2]>
                ((string *)local_c0,(Diligent *)"Unknown image layout (",
                 (char (*) [23])((long)&msg.field_2 + 8),(VkImageLayout *)0xcabce5,in_R8);
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"VkImageLayoutToResourceState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                 ,0x5df);
      std::__cxx11::string::~string((string *)local_c0);
      msg.field_2._12_4_ = 1;
    }
  }
  return msg.field_2._12_4_;
}

Assistant:

RESOURCE_STATE VkImageLayoutToResourceState(VkImageLayout Layout)
{
    static_assert(RESOURCE_STATE_MAX_BIT == (1u << 21), "This function must be updated to handle new resource state flag");
    switch (Layout)
    {
        // clang-format off
        case VK_IMAGE_LAYOUT_UNDEFINED:                                    return RESOURCE_STATE_UNDEFINED;
        case VK_IMAGE_LAYOUT_GENERAL:                                      return RESOURCE_STATE_UNORDERED_ACCESS;
        case VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL:                     return RESOURCE_STATE_RENDER_TARGET;
        case VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL:             return RESOURCE_STATE_DEPTH_WRITE;
        case VK_IMAGE_LAYOUT_DEPTH_STENCIL_READ_ONLY_OPTIMAL:              return RESOURCE_STATE_DEPTH_READ;
        case VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL:                     return RESOURCE_STATE_SHADER_RESOURCE;
        case VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL:                         return RESOURCE_STATE_COPY_SOURCE;
        case VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL:                         return RESOURCE_STATE_COPY_DEST;
        case VK_IMAGE_LAYOUT_PREINITIALIZED:                               UNEXPECTED("This layout is not supported"); return RESOURCE_STATE_UNDEFINED;
        case VK_IMAGE_LAYOUT_DEPTH_READ_ONLY_STENCIL_ATTACHMENT_OPTIMAL:   UNEXPECTED("This layout is not supported"); return RESOURCE_STATE_UNDEFINED;
        case VK_IMAGE_LAYOUT_DEPTH_ATTACHMENT_STENCIL_READ_ONLY_OPTIMAL:   UNEXPECTED("This layout is not supported"); return RESOURCE_STATE_UNDEFINED;
        case VK_IMAGE_LAYOUT_PRESENT_SRC_KHR:                              return RESOURCE_STATE_PRESENT;
        case VK_IMAGE_LAYOUT_SHARED_PRESENT_KHR:                           UNEXPECTED("This layout is not supported"); return RESOURCE_STATE_UNDEFINED;
        case VK_IMAGE_LAYOUT_FRAGMENT_DENSITY_MAP_OPTIMAL_EXT:
        case VK_IMAGE_LAYOUT_FRAGMENT_SHADING_RATE_ATTACHMENT_OPTIMAL_KHR: return RESOURCE_STATE_SHADING_RATE;
        // clang-format on
        default:
            UNEXPECTED("Unknown image layout (", Layout, ")");
            return RESOURCE_STATE_UNDEFINED;
    }
}